

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_RetRetimeForward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int iObj;
  int iFlop;
  long lVar1;
  
  if (0 < vSet->nSize) {
    lVar1 = 0;
    do {
      iObj = vSet->pArray[lVar1];
      iFlop = Wln_RetRemoveOneFanin(p,iObj);
      if (iFlop != -1) {
        Wln_RetInsertOneFanout(p,iObj,iFlop);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < vSet->nSize);
  }
  return;
}

Assistant:

void Wln_RetRetimeForward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj, iFlop;
    Vec_IntForEachEntry( vSet, iObj, i )
    {
        iFlop = Wln_RetRemoveOneFanin( p, iObj );
        if ( iFlop == -1 )
            continue;
        Wln_RetInsertOneFanout( p, iObj, iFlop );
    }
}